

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item_Array.cxx
# Opt level: O2

int __thiscall
Fl_Tree_Item_Array::reparent
          (Fl_Tree_Item_Array *this,Fl_Tree_Item *item,Fl_Tree_Item *newparent,int pos)

{
  Fl_Tree_Item **ppFVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  
  iVar2 = -1;
  if ((-1 < pos) && (iVar2 = -1, pos <= this->_total)) {
    enlarge(this,1);
    iVar2 = this->_total;
    this->_total = iVar2 + 1;
    uVar3 = (ulong)(uint)pos;
    for (lVar4 = (long)iVar2; ppFVar1 = this->_items, (long)uVar3 < lVar4; lVar4 = lVar4 + -1) {
      ppFVar1[lVar4] = ppFVar1[lVar4 + -1];
    }
    ppFVar1[uVar3] = item;
    ppFVar1 = this->_items;
    ppFVar1[uVar3]->_parent = newparent;
    Fl_Tree_Item::update_prev_next(ppFVar1[uVar3],pos);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int Fl_Tree_Item_Array::reparent(Fl_Tree_Item *item, Fl_Tree_Item* newparent, int pos) {
  if ( pos<0 || pos>_total ) return -1;
  // Add item to new parent
  enlarge(1);
  _total += 1;
  for ( int t=_total-1; t>pos; --t )    // shuffle array to make room for new entry
    _items[t] = _items[t-1];
  _items[pos] = item;                   // insert new entry
  // Attach to new parent and siblings
  _items[pos]->parent(newparent);       // reparent (update_prev_next() needs this)
  _items[pos]->update_prev_next(pos);   // find new siblings
  return 0;
}